

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * quoteIfNeeded(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_81;
  string local_80;
  string output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = std::__cxx11::string::find((char)input,0x22);
  uVar2 = std::__cxx11::string::find((char)input,0x20);
  uVar3 = std::__cxx11::string::find_first_of((char *)input,0x15da3b);
  if ((uVar3 & uVar2 & uVar1) == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    if (uVar1 == 0xffffffffffffffff) {
      std::__cxx11::string::_M_assign((string *)&output);
    }
    else {
      escape(&local_80,input,0x22);
      std::__cxx11::string::operator=((string *)&output,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\"",&local_81);
    std::operator+(&local_80,&local_40,&output);
    std::operator+(__return_storage_ptr__,&local_80,"\"");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&output);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string quoteIfNeeded (const std::string& input)
{
  auto quote = input.find ('"');
  auto space = input.find (' ');
  auto op    = input.find_first_of ("-+/()<^!=~_%");

  if (quote == std::string::npos &&
      space == std::string::npos &&
      op    == std::string::npos)
  {
    return input;
  }

  std::string output;
  if (quote != std::string::npos)
  {
    output = escape (input, '"');
  }
  else
  {
    output = input;
  }

  return std::string ("\"") + output + "\"";
}